

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<double,_-1,_1,_-1,_1>::resize
          (DenseStorage<double,__1,_1,__1,_1> *this,DenseIndex size,DenseIndex param_2,
          DenseIndex nbCols)

{
  double *pdVar1;
  DenseIndex nbCols_local;
  DenseIndex param_2_local;
  DenseIndex size_local;
  DenseStorage<double,__1,_1,__1,_1> *this_local;
  
  if (size != this->m_cols) {
    internal::conditional_aligned_delete_auto<double,true>(this->m_data,this->m_cols);
    if (size == 0) {
      this->m_data = (double *)0x0;
    }
    else {
      pdVar1 = internal::conditional_aligned_new_auto<double,true>(size);
      this->m_data = pdVar1;
    }
  }
  this->m_cols = nbCols;
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resize(DenseIndex size, DenseIndex, DenseIndex nbCols)
    {
      if(size != _Rows*m_cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Rows*m_cols);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN
      }
      m_cols = nbCols;
    }